

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint16_t container_maximum(container_t *c,uint8_t type)

{
  uint16_t uVar1;
  bitset_container_t *container;
  long lVar2;
  uint8_t local_9;
  
  local_9 = type;
  container = (bitset_container_t *)container_unwrap_shared(c,&local_9);
  if (local_9 == '\x03') {
    lVar2 = (long)container->cardinality;
    if (lVar2 != 0) {
      return *(short *)((long)container->words + lVar2 * 4 + -2) +
             *(short *)((long)container->words + lVar2 * 4 + -4);
    }
  }
  else {
    if (local_9 != '\x02') {
      if (local_9 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x18c4,"uint16_t container_maximum(const container_t *, uint8_t)");
      }
      uVar1 = bitset_container_maximum(container);
      return uVar1;
    }
    if ((long)container->cardinality != 0) {
      return *(uint16_t *)((long)container->words + (long)container->cardinality * 2 + -2);
    }
  }
  return 0;
}

Assistant:

static inline uint16_t container_maximum(
    const container_t *c, uint8_t type
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_maximum(const_CAST_bitset(c));
        case ARRAY_CONTAINER_TYPE:
            return array_container_maximum(const_CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_maximum(const_CAST_run(c));
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}